

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PortSymbols.cpp
# Opt level: O2

PortConnection * __thiscall
slang::ast::anon_unknown_0::PortConnectionBuilder::implicitNamedPort<slang::ast::PortSymbol>
          (PortConnectionBuilder *this,PortSymbol *port,
          span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL> attributes,
          SourceRange range,bool isWildcard)

{
  undefined8 uVar1;
  undefined4 uVar2;
  optional<bool> oVar3;
  Symbol *this_00;
  Diagnostic *pDVar4;
  PortConnection *pPVar5;
  char *pcVar6;
  LookupLocation target;
  string_view name;
  Symbol *symbol;
  Symbol *local_48;
  SourceRange local_40;
  
  local_40.endLoc = range.endLoc;
  local_40.startLoc = range.startLoc;
  pcVar6 = (char *)0x4004;
  if (((this->instance->body->flags).m_bits & 2) == 0) {
    pcVar6 = (char *)((ulong)isWildcard << 2);
  }
  name._M_str = pcVar6;
  name._M_len = (size_t)(port->super_Symbol).name._M_str;
  this_00 = Lookup::unqualified((Lookup *)this->scope,(Scope *)(port->super_Symbol).name._M_len,name
                                ,(bitmask<slang::ast::LookupFlags>)range.startLoc._0_4_);
  local_48 = this_00;
  if (this_00 != (Symbol *)0x0) {
    uVar1 = (this->lookupLocation).scope;
    uVar2 = (this->lookupLocation).index;
    target.index = uVar2;
    target.scope = (Scope *)uVar1;
    target._12_4_ = 0;
    oVar3 = Symbol::isDeclaredBefore(this_00,target);
    if (((ushort)oVar3.super__Optional_base<bool,_true,_true>._M_payload.
                 super__Optional_payload_base<bool> & 1) == 0 &&
        ((ushort)oVar3.super__Optional_base<bool,_true,_true>._M_payload.
                 super__Optional_payload_base<bool> >> 8 & 1) != 0) {
      pDVar4 = Scope::addDiag(this->scope,(DiagCode)0x3e000a,range);
      Diagnostic::operator<<(pDVar4,(port->super_Symbol).name);
      Diagnostic::addNote(pDVar4,(DiagCode)0x50001,this_00->location);
    }
    pPVar5 = BumpAllocator::
             emplace<slang::ast::PortConnection,slang::ast::PortSymbol_const&,slang::ast::Symbol_const*&,slang::SourceRange&>
                       (&this->comp->super_BumpAllocator,port,&local_48,&local_40);
    if (attributes._M_extent._M_extent_value._M_extent_value != 0) {
      Compilation::setAttributes(this->comp,pPVar5,attributes);
    }
    return pPVar5;
  }
  if (((isWildcard) &&
      (port->initializerSyntax != (ExpressionSyntax *)0x0 || port->initializer != (Expression *)0x0)
      ) && (port->direction == In)) {
    pPVar5 = defaultConnection(this,port,attributes);
    return pPVar5;
  }
  pDVar4 = Scope::addDiag(this->scope,(DiagCode)0x480006,range);
  Diagnostic::operator<<(pDVar4,(port->super_Symbol).name);
  pPVar5 = emptyConnection(this,port);
  return pPVar5;
}

Assistant:

PortConnection* implicitNamedPort(const TPort& port,
                                      std::span<const AttributeSymbol* const> attributes,
                                      SourceRange range, bool isWildcard) {
        // An implicit named port connection is semantically equivalent to `.port(port)` except:
        // - Can't create implicit net declarations this way
        // - Port types need to be equivalent, not just assignment compatible
        // - An implicit connection between nets of two dissimilar net types shall issue an
        //   error when it is a warning in an explicit named port connection

        bitmask<LookupFlags> flags;
        if (isWildcard)
            flags |= LookupFlags::DisallowWildcardImport;

        if (instance.body.flags.has(InstanceFlags::FromBind))
            flags |= LookupFlags::DisallowWildcardImport | LookupFlags::DisallowUnitReferences;

        auto symbol = Lookup::unqualified(scope, port.name, flags);
        if (!symbol) {
            // If this is a wildcard connection, we're allowed to use the port's default value,
            // if it has one.
            if (isWildcard && port.hasInitializer() && port.direction == ArgumentDirection::In)
                return defaultConnection(port, attributes);

            scope.addDiag(diag::ImplicitNamedPortNotFound, range) << port.name;
            return emptyConnection(port);
        }

        if (!symbol->isDeclaredBefore(lookupLocation).value_or(true)) {
            auto& diag = scope.addDiag(diag::UsedBeforeDeclared, range);
            diag << port.name;
            diag.addNote(diag::NoteDeclarationHere, symbol->location);
        }

        auto conn = comp.emplace<PortConnection>(port, symbol, range);
        if (!attributes.empty())
            comp.setAttributes(*conn, attributes);

        return conn;
    }